

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_651827::ContentProvider::provideStreamData
          (ContentProvider *this,QPDFObjGen *param_1,Pipeline *p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  size_type *psVar3;
  string all_description;
  string description;
  Pl_Concatenate concat;
  string local_c8;
  string local_a8;
  QPDFObjGen local_88 [2];
  long local_78 [2];
  QPDFObjectHandle local_68;
  Pl_Concatenate local_58;
  
  Pl_Concatenate::Pl_Concatenate(&local_58,"concatenate",p);
  local_88[0] = QPDFObjectHandle::getObjGen(&this->from_page);
  QPDFObjGen::unparse_abi_cxx11_(&local_c8,local_88,' ');
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,0x279ac3);
  psVar3 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_a8.field_2._M_allocated_capacity = *psVar3;
    local_a8.field_2._8_8_ = plVar2[3];
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  }
  else {
    local_a8.field_2._M_allocated_capacity = *psVar3;
    local_a8._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_a8._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  paVar1 = &local_c8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  local_88[0] = (QPDFObjGen)local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"/Contents","");
  QPDFObjectHandle::getKey(&local_68,(string *)&this->from_page);
  QPDFObjectHandle::pipeContentStreams(&local_68,&local_58.super_Pipeline,&local_a8,&local_c8);
  if (local_68.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_88[0] != (QPDFObjGen)local_78) {
    operator_delete((void *)local_88[0],local_78[0] + 1);
  }
  Pl_Concatenate::manualFinish(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  Pl_Concatenate::~Pl_Concatenate(&local_58);
  return;
}

Assistant:

void
ContentProvider::provideStreamData(QPDFObjGen const&, Pipeline* p)
{
    Pl_Concatenate concat("concatenate", p);
    std::string description = "contents from page object " + from_page.getObjGen().unparse(' ');
    std::string all_description;
    from_page.getKey("/Contents").pipeContentStreams(&concat, description, all_description);
    concat.manualFinish();
}